

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::Uint64(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
         *this,uint64_t i)

{
  uint64_t *puVar1;
  
  puVar1 = (uint64_t *)(this->stack_).stackTop_;
  if ((this->stack_).stackEnd_ <= puVar1 + 3) {
    internal::Stack<rapidjson::CrtAllocator>::
    Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (&this->stack_,1);
    puVar1 = (uint64_t *)(this->stack_).stackTop_;
  }
  (this->stack_).stackTop_ = (char *)(puVar1 + 3);
  puVar1[1] = 0;
  *(undefined4 *)(puVar1 + 2) = 0x2206;
  *puVar1 = i;
  if ((-1 < (long)i) && (*(undefined4 *)(puVar1 + 2) = 0x3206, i >> 0x20 == 0)) {
    *(uint *)(puVar1 + 2) = (uint)(i >> 0x1f == 0) << 10 | 0x3a06;
  }
  return true;
}

Assistant:

bool Uint64(uint64_t i) { new (stack_.template Push<ValueType>()) ValueType(i); return true; }